

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall Rml::Element::SetProperty(Element *this,String *name,String *value)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  PropertyMap *this_00;
  reference ppVar4;
  const_iterator cVar5;
  pair<Rml::PropertyId,_Rml::Property> *property;
  const_iterator __end1;
  const_iterator __begin1;
  PropertyMap *__range1;
  undefined1 local_58 [8];
  PropertyDictionary properties;
  String *value_local;
  String *name_local;
  Element *this_local;
  
  properties.properties._40_8_ = value;
  PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_58);
  bVar1 = StyleSheetSpecification::ParsePropertyDeclaration
                    ((PropertyDictionary *)local_58,name,(String *)properties.properties._40_8_);
  if (bVar1) {
    this_00 = PropertyDictionary::GetProperties((PropertyDictionary *)local_58);
    cVar5 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::begin(this_00);
    __end1.mInfo = (uint8_t *)cVar5.mKeyVals;
    cVar5 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::end(this_00);
    while( true ) {
      __end1.mKeyVals = (NodePtr)cVar5.mInfo;
      property = &(cVar5.mKeyVals)->mData;
      bVar1 = robin_hood::detail::
              Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
              ::Iter<true>::operator!=((Iter<true> *)&__end1.mInfo,(Iter<true> *)&property);
      if (!bVar1) break;
      ppVar4 = robin_hood::detail::
               Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
               ::Iter<true>::operator*((Iter<true> *)&__end1.mInfo);
      bVar1 = ElementStyle::SetProperty(&this->meta->style,ppVar4->first,&ppVar4->second);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_0054d3c1;
      }
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::Iter<true>::operator++((Iter<true> *)&__end1.mInfo);
      cVar5.mInfo = (uint8_t *)__end1.mKeyVals;
      cVar5.mKeyVals = (NodePtr)property;
    }
    this_local._7_1_ = true;
  }
  else {
    uVar2 = ::std::__cxx11::string::c_str();
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Syntax error parsing inline property declaration \'%s: %s;\'.",uVar2,
                 uVar3);
    this_local._7_1_ = false;
  }
LAB_0054d3c1:
  PropertyDictionary::~PropertyDictionary((PropertyDictionary *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Element::SetProperty(const String& name, const String& value)
{
	// The name may be a shorthand giving us multiple underlying properties
	PropertyDictionary properties;
	if (!StyleSheetSpecification::ParsePropertyDeclaration(properties, name, value))
	{
		Log::Message(Log::LT_WARNING, "Syntax error parsing inline property declaration '%s: %s;'.", name.c_str(), value.c_str());
		return false;
	}
	for (auto& property : properties.GetProperties())
	{
		if (!meta->style.SetProperty(property.first, property.second))
			return false;
	}
	return true;
}